

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O2

void Diligent::GLSLangUtils::anon_unknown_3::LogCompilerError
               (char *DebugOutputMessage,char *InfoLog,char *InfoDebugLog,char *ShaderSource,
               size_t SourceCodeLen,IDataBlob **ppCompilerOutput)

{
  void *__dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1;
  string _msg;
  string ErrorLog;
  char *DebugOutputMessage_local;
  
  Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ShaderSource;
  DebugOutputMessage_local = DebugOutputMessage;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ErrorLog,InfoLog,(allocator<char> *)&_msg);
  if (*InfoDebugLog != '\0') {
    std::__cxx11::string::push_back((char)&ErrorLog);
    std::__cxx11::string::append((char *)&ErrorLog);
  }
  FormatString<char_const*,std::__cxx11::string>
            (&_msg,(Diligent *)&DebugOutputMessage_local,(char **)&ErrorLog,Args_1);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&_msg);
  if (ppCompilerOutput != (IDataBlob **)0x0) {
    DataBlobImpl::Create
              ((DataBlobImpl *)&_msg,SourceCodeLen + ErrorLog._M_string_length + 2,(void *)0x0);
    __dest = DataBlobImpl::GetDataPtr((DataBlobImpl *)_msg._M_dataplus._M_p,0);
    memcpy(__dest,ErrorLog._M_dataplus._M_p,ErrorLog._M_string_length + 1);
    memcpy((void *)((long)__dest + ErrorLog._M_string_length + 1),ShaderSource,SourceCodeLen + 1);
    DataBlobImpl::QueryInterface
              ((DataBlobImpl *)_msg._M_dataplus._M_p,(INTERFACE_ID *)IID_DataBlob,
               (IObject **)ppCompilerOutput);
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release((RefCntAutoPtr<Diligent::DataBlobImpl> *)&_msg);
  }
  std::__cxx11::string::~string((string *)&ErrorLog);
  return;
}

Assistant:

void LogCompilerError(const char* DebugOutputMessage,
                      const char* InfoLog,
                      const char* InfoDebugLog,
                      const char* ShaderSource,
                      size_t      SourceCodeLen,
                      IDataBlob** ppCompilerOutput)
{
    std::string ErrorLog(InfoLog);
    if (*InfoDebugLog != '\0')
    {
        ErrorLog.push_back('\n');
        ErrorLog.append(InfoDebugLog);
    }
    LOG_ERROR_MESSAGE(DebugOutputMessage, ErrorLog);

    if (ppCompilerOutput != nullptr)
    {
        auto  pOutputDataBlob = DataBlobImpl::Create(SourceCodeLen + 1 + ErrorLog.length() + 1);
        char* DataPtr         = pOutputDataBlob->GetDataPtr<char>();
        memcpy(DataPtr, ErrorLog.data(), ErrorLog.length() + 1);
        memcpy(DataPtr + ErrorLog.length() + 1, ShaderSource, SourceCodeLen + 1);
        pOutputDataBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppCompilerOutput));
    }
}